

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:658:11)>
::getImpl(SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:658:11)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<unsigned_long> depResult;
  Array<char> local_388;
  NullableValue<kj::Exception> local_370;
  char local_1d8;
  size_t local_1d0;
  ExceptionOr<kj::String> local_1c8;
  
  local_370.isSet = false;
  local_1d8 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_370);
  if (local_370.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1c8,&local_370.field_1.value);
    local_1c8.value.ptr.isSet = false;
    ExceptionOr<kj::String>::operator=((ExceptionOr<kj::String> *)output,&local_1c8);
    ExceptionOr<kj::String>::~ExceptionOr(&local_1c8);
  }
  else if (local_1d8 == '\x01') {
    anon_class_8_1_8ba005cc_for_func::operator()((String *)&local_388,&this->func,local_1d0);
    local_1c8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1c8.value.ptr.isSet = true;
    local_1c8.value.ptr.field_1.value.content.ptr = local_388.ptr;
    local_1c8.value.ptr.field_1.value.content.size_ = local_388.size_;
    local_1c8.value.ptr.field_1.value.content.disposer = local_388.disposer;
    local_388.ptr = (char *)0x0;
    local_388.size_ = 0;
    ExceptionOr<kj::String>::operator=((ExceptionOr<kj::String> *)output,&local_1c8);
    ExceptionOr<kj::String>::~ExceptionOr(&local_1c8);
    Array<char>::~Array(&local_388);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_370);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }